

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polyself.c
# Opt level: O1

void init_uasmon(void)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined2 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined3 uVar7;
  long lVar8;
  permonst *ppVar9;
  
  lVar8 = (long)u.umonster;
  upermonst.mname = mons[lVar8].mname;
  ppVar9 = mons + lVar8;
  upermonst.mlet = ppVar9->mlet;
  upermonst.mlevel = ppVar9->mlevel;
  upermonst.mmove = ppVar9->mmove;
  upermonst.ac = ppVar9->ac;
  upermonst.mr = ppVar9->mr;
  upermonst.maligntyp = ppVar9->maligntyp;
  upermonst.geno = ppVar9->geno;
  upermonst.mattk._0_8_ = *(undefined8 *)mons[lVar8].mattk;
  upermonst.mattk._8_8_ = *(undefined8 *)(mons[lVar8].mattk + 2);
  upermonst.mattk._16_8_ = *(undefined8 *)(mons[lVar8].mattk + 4);
  ppVar9 = mons + lVar8;
  upermonst.cwt = ppVar9->cwt;
  upermonst.cnutrit = ppVar9->cnutrit;
  upermonst.pxtyp = ppVar9->pxtyp;
  upermonst.msound = ppVar9->msound;
  upermonst.msize = ppVar9->msize;
  uVar1 = mons[lVar8].mflags1;
  uVar2 = mons[lVar8].mflags2;
  ppVar9 = mons + lVar8;
  uVar3 = ppVar9->mflags3;
  uVar4 = ppVar9->mresists;
  uVar5 = ppVar9->mconveys;
  uVar6 = ppVar9->mcolor;
  uVar7 = *(undefined3 *)&ppVar9->field_0x3d;
  upermonst._61_3_ = uVar7;
  upermonst.mcolor = uVar6;
  upermonst.mconveys = uVar5;
  upermonst.mresists = uVar4;
  ppVar9 = &upermonst;
  lVar8 = (long)urace.malenum;
  upermonst.mflags2 = uVar2 & 0xbbfffff6 | mons[lVar8].mflags2;
  upermonst.mflags1 = uVar1 & 0x9ffdffff | mons[lVar8].mflags1;
  upermonst.mflags3 = uVar3 & 0xfdff | mons[lVar8].mflags3;
  if (lVar8 == 0xe8) {
    upermonst.mattk[4].aatyp = '\0';
    upermonst.mattk[4].adtyp = '\0';
    upermonst.mattk[4].damn = '\0';
    upermonst.mattk[4].damd = '\0';
    upermonst.mattk[5].aatyp = '\0';
    upermonst.mattk[5].adtyp = '\0';
    upermonst.mattk[5].damn = '\0';
    upermonst.mattk[5].damd = '\0';
    upermonst.mattk[0].aatyp = '\x01';
    upermonst.mattk[0].adtyp = '\0';
    upermonst.mattk[0].damn = '\x01';
    upermonst.mattk[0].damd = '\x06';
    upermonst.mattk[1].aatyp = '\x02';
    upermonst.mattk[1].adtyp = '\x0f';
    upermonst.mattk[1].damn = '\x01';
    upermonst.mattk[1].damd = '\x06';
    upermonst.mattk[2].aatyp = '\0';
    upermonst.mattk[2].adtyp = '\0';
    upermonst.mattk[2].damn = '\0';
    upermonst.mattk[2].damd = '\0';
    upermonst.mattk[3].aatyp = '\0';
    upermonst.mattk[3].adtyp = '\0';
    upermonst.mattk[3].damn = '\0';
    upermonst.mattk[3].damd = '\0';
  }
  if (u.umonnum != u.umonster) {
    ppVar9 = mons + u.umonnum;
  }
  set_mon_data(&youmonst,ppVar9,0);
  return;
}

Assistant:

void init_uasmon(void)
{
	int i;

	upermonst = mons[u.umonster];

	/* Fix up the flags */
	/* Default flags assume human, so replace with your race's flags. */

	upermonst.mflags1 &= ~(mons[PM_HUMAN].mflags1);
	upermonst.mflags1 |= (mons[urace.malenum].mflags1);

	upermonst.mflags2 &= ~(mons[PM_HUMAN].mflags2);
	upermonst.mflags2 |= (mons[urace.malenum].mflags2);

	upermonst.mflags3 &= ~(mons[PM_HUMAN].mflags3);
	upermonst.mflags3 |= (mons[urace.malenum].mflags3);

	/* Fix up the attacks for vampires */
	/* This replaces the role's attacks with the vampire's race attacks. */
	if (Race_if(PM_VAMPIRE)) {
	    for (i = 0; i < NATTK; i++) {
		upermonst.mattk[i] = mons[urace.malenum].mattk[i];
	    }
	}

	set_uasmon();
}